

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

void __thiscall
ot::commissioner::coap::Coap::Coap(Coap *this,event_base *aEventBase,Endpoint *aEndpoint)

{
  _Rb_tree_header *p_Var1;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  Duration local_28;
  
  this->_vptr_Coap = (_func_int **)&PTR__Coap_00276770;
  this->mMessageId = 0;
  p_Var1 = &(this->mResources)._M_t._M_impl.super__Rb_tree_header;
  (this->mResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mResources)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48._8_8_ = 0;
  pcStack_30 = std::
               _Function_handler<void_(ot::commissioner::Timer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap.cpp:509:34)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(ot::commissioner::Timer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap.cpp:509:34)>
             ::_M_manager;
  local_48._M_unused._M_object = this;
  RequestsCache::RequestsCache(&this->mRequestsCache,aEventBase,(Action *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  local_28.__r = 0x3c4d8;
  ResponsesCache::ResponsesCache(&this->mResponsesCache,aEventBase,&local_28);
  (this->mDefaultHandler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mDefaultHandler)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->mDefaultHandler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->mDefaultHandler).super__Function_base._M_functor + 8) = 0;
  this->mEndpoint = aEndpoint;
  local_68._8_8_ = 0;
  pcStack_50 = std::
               _Function_handler<void_(ot::commissioner::Endpoint_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap.cpp:515:27)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(ot::commissioner::Endpoint_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap.cpp:515:27)>
             ::_M_manager;
  local_68._M_unused._M_object = this;
  std::
  function<void_(ot::commissioner::Endpoint_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  ::operator=(&aEndpoint->mReceiver,
              (function<void_(ot::commissioner::Endpoint_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
               *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  return;
}

Assistant:

Coap::Coap(struct event_base *aEventBase, Endpoint &aEndpoint)
    : mMessageId(0)
    , mRequestsCache(aEventBase, [this](Timer &aTimer) { Retransmit(aTimer); })
    , mResponsesCache(aEventBase, std::chrono::seconds(kExchangeLifetime))
    , mDefaultHandler(nullptr)
    , mEndpoint(aEndpoint)
{
    using namespace std::placeholders;
    mEndpoint.SetReceiver([this](Endpoint &aEndpoint, const ByteArray &aBuf) { Receive(aEndpoint, aBuf); });
}